

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMAttrNSImpl::setName(DOMAttrNSImpl *this,XMLCh *namespaceURI,XMLCh *qualifiedName)

{
  DOMDocument *pDVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  XMLCh *pXVar5;
  XMLCh *str2;
  XMLCh *pXVar6;
  DOMException *this_00;
  undefined4 extraout_var;
  undefined8 *puVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMDocumentImpl *this_01;
  
  pDVar1 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
  this_01 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  if (pDVar1 == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  pXVar5 = DOMNodeImpl::getXmlnsString();
  str2 = DOMNodeImpl::getXmlnsURIString();
  pXVar6 = DOMDocumentImpl::getPooledString(this_01,qualifiedName);
  (this->super_DOMAttrImpl).fName = pXVar6;
  uVar3 = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
  if ((int)uVar3 < 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar4) == 0) {
      puVar7 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar7 = (undefined8 *)(CONCAT44(extraout_var_02,iVar4) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar7);
    goto LAB_00270877;
  }
  pXVar6 = (this->super_DOMAttrImpl).fName;
  if (uVar3 != 0) {
    pXVar5 = DOMDocumentImpl::getPooledNString(this_01,pXVar6,(ulong)uVar3);
    this->fPrefix = pXVar5;
    pXVar5 = DOMDocumentImpl::getPooledString
                       (this_01,(this->super_DOMAttrImpl).fName + (ulong)uVar3 + 1);
    this->fLocalName = pXVar5;
    bVar2 = DOMDocumentImpl::isXMLName(this_01,this->fPrefix);
    if (bVar2) {
      bVar2 = DOMDocumentImpl::isXMLName(this_01,this->fLocalName);
      if (bVar2) {
        pXVar5 = this->fPrefix;
        goto LAB_002707b1;
      }
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var,iVar4) == 0) {
      puVar7 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar7 = (undefined8 *)(CONCAT44(extraout_var_01,iVar4) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar7);
LAB_00270877:
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  bVar2 = XMLString::equals(pXVar6,pXVar5);
  if (bVar2) {
    bVar2 = XMLString::equals(namespaceURI,str2);
    if (!bVar2) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      if (CONCAT44(extraout_var_03,iVar4) == 0) {
        puVar7 = &XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
        puVar7 = (undefined8 *)(CONCAT44(extraout_var_04,iVar4) + 0x158);
      }
      DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar7);
      goto LAB_00270877;
    }
    this->fPrefix = (XMLCh *)0x0;
    this->fLocalName = (this->super_DOMAttrImpl).fName;
    goto LAB_002707cc;
  }
  this->fPrefix = (XMLCh *)0x0;
  this->fLocalName = (this->super_DOMAttrImpl).fName;
  pXVar5 = (XMLCh *)0x0;
LAB_002707b1:
  pXVar6 = (XMLCh *)0x0;
  if ((namespaceURI != (XMLCh *)0x0) && (*namespaceURI != L'\0')) {
    pXVar6 = namespaceURI;
  }
  str2 = DOMNodeImpl::mapPrefix(pXVar5,pXVar6,2);
LAB_002707cc:
  if (str2 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    pXVar5 = DOMDocumentImpl::getPooledString(this_01,str2);
  }
  this->fNamespaceURI = pXVar5;
  return;
}

Assistant:

void DOMAttrNSImpl::setName(const XMLCh* namespaceURI, const XMLCh* qualifiedName)
{
    DOMDocumentImpl* ownerDoc = (DOMDocumentImpl *)fParent.fOwnerDocument;
    const XMLCh * xmlns = DOMNodeImpl::getXmlnsString();
    const XMLCh * xmlnsURI = DOMNodeImpl::getXmlnsURIString();
    this->fName = ownerDoc->getPooledString(qualifiedName);

    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    bool xmlnsAlone = false;	//true if attribute name is "xmlns"
    if (index == 0)
    {	//qualifiedName contains no ':'
        if (XMLString::equals(this->fName, xmlns)) {
            if (!XMLString::equals(namespaceURI, xmlnsURI))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
            xmlnsAlone = true;
        }
        fPrefix = 0;
        fLocalName = fName;
    }
    else
    {
        fPrefix = ownerDoc->getPooledNString(fName, index);
        fLocalName = ownerDoc->getPooledString(fName+index+1);

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (!ownerDoc->isXMLName(fPrefix) || !ownerDoc->isXMLName(fLocalName))
            throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    // DOM Level 3: namespace URI is never empty string.
    const XMLCh * URI = xmlnsAlone ? xmlnsURI
        : DOMNodeImpl::mapPrefix
          (
              fPrefix,
              (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
              DOMNode::ATTRIBUTE_NODE
          );
    this -> fNamespaceURI = (URI == 0) ? 0 : ownerDoc->getPooledString(URI);
}